

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sexp_conflict
sexp_set_file_descriptor_status_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg2)

{
  sexp psVar1;
  int iVar2;
  sexp_conflict psVar3;
  long lVar4;
  
  if (((ulong)arg0 & 3) == 0) {
    if (2 < arg0->tag - 0x10) goto LAB_00103849;
  }
  else if (((ulong)arg0 & 1) == 0) {
LAB_00103849:
    psVar3 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a port or file descriptor");
    return psVar3;
  }
  if ((((ulong)arg2 & 1) == 0) && ((((ulong)arg2 & 2) != 0 || (arg2->tag != 0xc)))) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg2);
    return psVar3;
  }
  if (((ulong)arg0 & 3) == 0) {
    if (arg0->tag - 0x10 < 2) {
      psVar1 = (arg0->value).type.getters;
      if (psVar1 == (sexp)0x0) {
        psVar1 = (arg0->value).type.slots;
        iVar2 = -1;
        if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
          iVar2 = (int)(psVar1->value).fileno.fd;
        }
      }
      else {
        iVar2 = fileno((FILE *)psVar1);
      }
      goto LAB_00103877;
    }
    if (arg0->tag == 0x12) {
      iVar2 = (int)(arg0->value).fileno.fd;
      goto LAB_00103877;
    }
  }
  iVar2 = (int)((long)arg0 >> 1);
LAB_00103877:
  if (((ulong)arg2 & 1) == 0) {
    if ((((ulong)arg2 & 2) == 0) && (arg2->tag == 0xc)) {
      lVar4 = (long)(arg2->value).flonum_bits[0] * (arg2->value).uvector.length;
    }
    else {
      lVar4 = 0;
    }
  }
  else {
    lVar4 = (long)arg2 >> 1;
  }
  iVar2 = fcntl(iVar2,4,lVar4);
  return (sexp_conflict)((ulong)(iVar2 == 0) << 8 | 0x3e);
}

Assistant:

sexp sexp_set_file_descriptor_status_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg2) {
  int err = 0;
  sexp res;
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  err = fcntl((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), F_SETFL, sexp_sint_value(arg2));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}